

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.cpp
# Opt level: O3

void main::anon_class_1_0_00000001::__invoke(int param_1)

{
  run = 0;
  return;
}

Assistant:

int main() {
    std::signal(SIGINT, [](int) {
        run = false;
    });

    TerminalInfo term;
    term.detect();

    RealCanvas<BrailleCanvas> canvas({ { 0.0f, 1.0f }, { 1.0f, -1.0f } }, Size(30, 7), term);
    auto layout = margin(frame(&canvas, term));

    auto bounds = canvas.bounds();
    auto size = canvas.size();
    auto pixel = canvas.unmap_size({ 1, 1 });

    float A = size.y/2.0f;
    float f = 2.0f;

    auto sin = [A,f](float t) {
        return A*std::sin(2*3.141592f*f*t);
    };

    auto cos = [A,f](float t) {
        return A*std::cos(2*3.141592f*f*t);
    };

    auto plot_fn = [](auto const& fn, float t_) {
        return [&fn, t_](float x) -> Pointf {
            return { x, fn(t_ + x) };
        };
    };

    // Plot function in range [bounds.p1.x, bounds.p2.x] with step of 1px
    // Actually, the range is [bounds.p1.x, bounds.p2.x + 1px)
    range_iterator<float> rng(bounds.p1.x, bounds.p2.x + pixel.x, pixel.x);
    range_iterator<float> rng_end;

    float t = 0.0f;

    while (true) {
        canvas.clear()
              .path(palette::royalblue, map(rng, plot_fn(sin, t)), map(rng_end, plot_fn(sin, t)))
              .path(palette::red, map(rng, plot_fn(cos, t)), map(rng_end, plot_fn(cos, t)))
              .line(term.foreground_color, { bounds.p1.x, 0.0f }, { bounds.p2.x, 0.0f }, TerminalOp::ClipSrc);

        for (auto const& line: layout)
            std::cout << term.clear_line() << line << '\n';

        std::cout << std::flush;

        if (!run)
            break;

        using namespace std::chrono_literals;
        std::this_thread::sleep_for(40ms);

        if (!run)
            break;

        t += 0.01f;
        if (t >= 1.0f)
            t -= std::trunc(t);

        std::cout << term.move_up(layout.size().y) << std::flush;
    }

    return 0;
}